

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

nodetest_t __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_node_test_type
          (xpath_parser *this,xpath_lexer_string *name)

{
  byte bVar1;
  bool bVar2;
  nodetest_t nVar3;
  
  bVar1 = *(byte *)&this->_alloc->_root;
  if (bVar1 < 0x70) {
    if (bVar1 == 99) {
      bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,"comment");
      nVar3 = nodetest_type_comment;
    }
    else {
      if (bVar1 != 0x6e) {
        return nodetest_none;
      }
      bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,"node");
      nVar3 = nodetest_type_node;
    }
  }
  else if (bVar1 == 0x70) {
    bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,"processing-instruction");
    nVar3 = nodetest_type_pi;
  }
  else {
    if (bVar1 != 0x74) {
      return nodetest_none;
    }
    bVar2 = xpath_lexer_string::operator==((xpath_lexer_string *)this,"text");
    nVar3 = nodetest_type_text;
  }
  if (bVar2 == false) {
    return nodetest_none;
  }
  return nVar3;
}

Assistant:

nodetest_t parse_node_test_type(const xpath_lexer_string& name)
		{
			switch (name.begin[0])
			{
			case 'c':
				if (name == PUGIXML_TEXT("comment"))
					return nodetest_type_comment;

				break;

			case 'n':
				if (name == PUGIXML_TEXT("node"))
					return nodetest_type_node;

				break;

			case 'p':
				if (name == PUGIXML_TEXT("processing-instruction"))
					return nodetest_type_pi;

				break;

			case 't':
				if (name == PUGIXML_TEXT("text"))
					return nodetest_type_text;

				break;

			default:
				break;
			}

			return nodetest_none;
		}